

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ExtensionGenerator::Generate
          (ExtensionGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  char *pcVar2;
  char *text;
  bool bVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  
  local_40._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_40._M_impl.super__Rb_tree_header._M_header;
  local_40._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40._M_impl.super__Rb_tree_header._M_header._M_right =
       local_40._M_impl.super__Rb_tree_header._M_header._M_left;
  InitTemplateVars(this->descriptor_,&this->scope_,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_40);
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_40,"public static final int $constant_name$ = $number$;\n");
  WriteFieldDocComment(printer,this->descriptor_);
  pFVar1 = this->descriptor_;
  if (*(int *)(*(long *)(*(long *)(pFVar1 + 0x20) + 0x88) + 0x50) == 3) {
    bVar3 = *(int *)(pFVar1 + 0x30) == 3;
    pcVar2 = 
    "public static final\n  com.google.protobuf.GeneratedMessageLite.GeneratedExtension<\n    $containing_type$,\n    $type$> $name$ = com.google.protobuf.GeneratedMessageLite\n        .newRepeatedGeneratedExtension(\n      $containing_type$.getDefaultInstance(),\n      $prototype$,\n      $enum_map$,\n      $number$,\n      com.google.protobuf.WireFormat.FieldType.$type_constant$,\n      $packed$);\n"
    ;
    text = 
    "public static final\n  com.google.protobuf.GeneratedMessageLite.GeneratedExtension<\n    $containing_type$,\n    $type$> $name$ = com.google.protobuf.GeneratedMessageLite\n        .newSingularGeneratedExtension(\n      $containing_type$.getDefaultInstance(),\n      $default$,\n      $prototype$,\n      $enum_map$,\n      $number$,\n      com.google.protobuf.WireFormat.FieldType.$type_constant$);\n"
    ;
  }
  else {
    bVar3 = *(long *)(pFVar1 + 0x40) == 0;
    pcVar2 = 
    "public static final\n  com.google.protobuf.GeneratedMessage.GeneratedExtension<\n    $containing_type$,\n    $type$> $name$ = com.google.protobuf.GeneratedMessage\n        .newFileScopedGeneratedExtension(\n      $singular_type$.class,\n      $prototype$);\n"
    ;
    text = 
    "public static final\n  com.google.protobuf.GeneratedMessage.GeneratedExtension<\n    $containing_type$,\n    $type$> $name$ = com.google.protobuf.GeneratedMessage\n        .newMessageScopedGeneratedExtension(\n      $scope$.getDefaultInstance(),\n      $index$,\n      $singular_type$.class,\n      $prototype$);\n"
    ;
  }
  if (bVar3) {
    text = pcVar2;
  }
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_40,text);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_40);
  return;
}

Assistant:

void ExtensionGenerator::Generate(io::Printer* printer) {
  map<string, string> vars;
  InitTemplateVars(descriptor_, scope_, &vars);
  printer->Print(vars,
      "public static final int $constant_name$ = $number$;\n");

  WriteFieldDocComment(printer, descriptor_);
  if (HasDescriptorMethods(descriptor_->file())) {
    // Non-lite extensions
    if (descriptor_->extension_scope() == NULL) {
      // Non-nested
      printer->Print(
          vars,
          "public static final\n"
          "  com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
          "    $containing_type$,\n"
          "    $type$> $name$ = com.google.protobuf.GeneratedMessage\n"
          "        .newFileScopedGeneratedExtension(\n"
          "      $singular_type$.class,\n"
          "      $prototype$);\n");
    } else {
      // Nested
      printer->Print(
          vars,
          "public static final\n"
          "  com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
          "    $containing_type$,\n"
          "    $type$> $name$ = com.google.protobuf.GeneratedMessage\n"
          "        .newMessageScopedGeneratedExtension(\n"
          "      $scope$.getDefaultInstance(),\n"
          "      $index$,\n"
          "      $singular_type$.class,\n"
          "      $prototype$);\n");
    }
  } else {
    // Lite extensions
    if (descriptor_->is_repeated()) {
      printer->Print(
          vars,
          "public static final\n"
          "  com.google.protobuf.GeneratedMessageLite.GeneratedExtension<\n"
          "    $containing_type$,\n"
          "    $type$> $name$ = com.google.protobuf.GeneratedMessageLite\n"
          "        .newRepeatedGeneratedExtension(\n"
          "      $containing_type$.getDefaultInstance(),\n"
          "      $prototype$,\n"
          "      $enum_map$,\n"
          "      $number$,\n"
          "      com.google.protobuf.WireFormat.FieldType.$type_constant$,\n"
          "      $packed$);\n");
    } else {
      printer->Print(
          vars,
          "public static final\n"
          "  com.google.protobuf.GeneratedMessageLite.GeneratedExtension<\n"
          "    $containing_type$,\n"
          "    $type$> $name$ = com.google.protobuf.GeneratedMessageLite\n"
          "        .newSingularGeneratedExtension(\n"
          "      $containing_type$.getDefaultInstance(),\n"
          "      $default$,\n"
          "      $prototype$,\n"
          "      $enum_map$,\n"
          "      $number$,\n"
          "      com.google.protobuf.WireFormat.FieldType.$type_constant$);\n");
    }
  }
}